

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickhull.hpp
# Opt level: O0

void __thiscall
quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>
::replace_neighbour(quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>
                    *this,size_type f,size_type _from,size_type _to)

{
  bool bVar1;
  reference pvVar2;
  reference puVar3;
  size_type *n;
  iterator __end0;
  iterator __begin0;
  facet_array *__range3;
  size_type _to_local;
  size_type _from_local;
  size_type f_local;
  quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>
  *this_local;
  
  if (_from != _to) {
    pvVar2 = std::
             deque<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
             ::operator[](&this->facets_,f);
    __end0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&pvVar2->neighbours_)
    ;
    n = (size_type *)
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&pvVar2->neighbours_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)&n), bVar1) {
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end0);
      if (*puVar3 == _from) {
        *puVar3 = _to;
        return;
      }
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end0);
    }
  }
  return;
}

Assistant:

void
    replace_neighbour(size_type const f,
                      size_type const _from,
                      size_type const _to)
    {
        if (_from != _to) {
            for (size_type & n : facets_[f].neighbours_) {
                if (n == _from) {
                    n = _to;
                    return;
                }
            }
        }
    }